

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

void __thiscall
VarnodeListSymbol::getFixedHandle(VarnodeListSymbol *this,FixedHandle *hand,ParserWalker *walker)

{
  PatternValue *pPVar1;
  VarnodeSymbol *pVVar2;
  uint uVar3;
  
  pPVar1 = (this->super_ValueSymbol).patval;
  uVar3 = (*(pPVar1->super_PatternExpression)._vptr_PatternExpression[2])(pPVar1,walker);
  pVVar2 = (this->varnode_table).
           super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
  hand->space = (pVVar2->fix).space;
  hand->offset_space = (AddrSpace *)0x0;
  hand->offset_offset = (pVVar2->fix).offset;
  hand->size = (pVVar2->fix).size;
  return;
}

Assistant:

void VarnodeListSymbol::getFixedHandle(FixedHandle &hand,ParserWalker &walker) const

{
  uint4 ind = (uint4) patval->getValue(walker);
  // The resolve routine has checked that -ind- must be a valid index
  const VarnodeData &fix( varnode_table[ind]->getFixedVarnode() );
  hand.space = fix.space;
  hand.offset_space = (AddrSpace *)0; // Not a dynamic value
  hand.offset_offset = fix.offset;
  hand.size = fix.size;
}